

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.cc
# Opt level: O2

void __thiscall PersistenceTest::prepare(PersistenceTest *this,uint64_t max)

{
  PersistenceTest *this_00;
  ostream *poVar1;
  int k;
  ulong uVar2;
  uint64_t uVar3;
  char cVar4;
  uint64_t key;
  long lVar5;
  bool bVar6;
  allocator<char> local_a9;
  PersistenceTest *local_a8;
  KVStore *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  uint64_t local_78;
  string local_70;
  string local_50;
  
  local_a0 = &(this->super_Test).store;
  local_a8 = this;
  KVStore::reset(local_a0);
  uVar3 = 0;
  local_78 = max;
  while (bVar6 = max != 0, max = max - 1, bVar6) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    cVar4 = (char)(uVar3 + 1);
    std::__cxx11::string::_M_construct((ulong)&local_98,cVar4);
    KVStore::put(local_a0,uVar3,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_98,cVar4);
    KVStore::get_abi_cxx11_(&local_70,local_a0,uVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fourstring[P]sLSMTree/persistence.cc"
               ,&local_a9);
    Test::expect<std::__cxx11::string>(&local_a8->super_Test,&local_98,&local_70,&local_50,0x15);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_98);
    uVar3 = uVar3 + 1;
  }
  Test::phase(&local_a8->super_Test);
  uVar3 = local_78;
  key = 0;
  while (bVar6 = uVar3 != 0, uVar3 = uVar3 - 1, bVar6) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_98,(char)(key + 1));
    KVStore::get_abi_cxx11_(&local_70,local_a0,key);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fourstring[P]sLSMTree/persistence.cc"
               ,&local_a9);
    Test::expect<std::__cxx11::string>(&local_a8->super_Test,&local_98,&local_70,&local_50,0x1b);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_98);
    key = key + 1;
  }
  Test::phase(&local_a8->super_Test);
  for (uVar2 = 0; uVar2 < local_78; uVar2 = uVar2 + 2) {
    local_70._M_dataplus._M_p._0_1_ = 1;
    local_50._M_dataplus._M_p._0_1_ = KVStore::del(local_a0,uVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fourstring[P]sLSMTree/persistence.cc"
               ,&local_a9);
    Test::expect<bool>(&local_a8->super_Test,(bool *)&local_70,(bool *)&local_50,&local_98,0x20);
    std::__cxx11::string::~string((string *)&local_98);
  }
  Test::phase(&local_a8->super_Test);
  for (uVar2 = 0; uVar2 < local_78; uVar2 = uVar2 + 4) {
    KVStore::get_abi_cxx11_(&local_98,local_a0,uVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fourstring[P]sLSMTree/persistence.cc"
               ,(allocator<char> *)&local_50);
    Test::expect<std::__cxx11::string>
              (&local_a8->super_Test,&Test::not_found_abi_cxx11_,&local_98,&local_70,0x24);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_98);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_98,(char)uVar2 + '\x01');
    KVStore::put(local_a0,uVar2,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  Test::phase(&local_a8->super_Test);
  for (uVar2 = 1; uVar2 < local_78; uVar2 = uVar2 + 4) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    cVar4 = (char)uVar2 + '\x01';
    std::__cxx11::string::_M_construct((ulong)&local_98,cVar4);
    KVStore::get_abi_cxx11_(&local_70,local_a0,uVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fourstring[P]sLSMTree/persistence.cc"
               ,&local_a9);
    Test::expect<std::__cxx11::string>(&local_a8->super_Test,&local_98,&local_70,&local_50,0x29);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_98);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_98,cVar4);
    KVStore::put(local_a0,uVar2,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  Test::phase(&local_a8->super_Test);
  for (uVar2 = 2; uVar2 < local_78; uVar2 = uVar2 + 4) {
    KVStore::get_abi_cxx11_(&local_98,local_a0,uVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fourstring[P]sLSMTree/persistence.cc"
               ,(allocator<char> *)&local_50);
    Test::expect<std::__cxx11::string>
              (&local_a8->super_Test,&Test::not_found_abi_cxx11_,&local_98,&local_70,0x2e);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_98);
  }
  Test::phase(&local_a8->super_Test);
  for (uVar2 = 3; this_00 = local_a8, uVar2 < local_78; uVar2 = uVar2 + 4) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_98,(char)uVar2 + '\x01');
    KVStore::get_abi_cxx11_(&local_70,local_a0,uVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fourstring[P]sLSMTree/persistence.cc"
               ,&local_a9);
    Test::expect<std::__cxx11::string>(&local_a8->super_Test,&local_98,&local_70,&local_50,0x32);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_98);
  }
  Test::phase(&local_a8->super_Test);
  Test::report(&this_00->super_Test);
  for (lVar5 = 0; lVar5 != 0x2801; lVar5 = lVar5 + 1) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_98,'\0');
    KVStore::put(local_a0,local_78 + lVar5,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Data is ready, please press ctrl-c/ctrl-d to terminate this program!");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ostream::flush();
  exit(0);
}

Assistant:

void prepare(uint64_t max) {
        uint64_t i;

        // Clean up
        store.reset();

        // Test multiple key-value pairs
        for (i = 0; i < max; ++i) {
            store.put(i, std::string(i + 1, 's'));
            EXPECT(std::string(i + 1, 's'), store.get(i));
        }
        phase();

        // Test after all insertions
        for (i = 0; i < max; ++i)
            EXPECT(std::string(i + 1, 's'), store.get(i));
        phase();

        // Test deletions
        for (i = 0; i < max; i += 2)
            EXPECT(true, store.del(i));

        phase();
        for (int i = 0; i < max; i += 4) {
            EXPECT(not_found, store.get(i));
            store.put(i, std::string(i + 1, 't'));
        }
        phase();
        for (int j = 1; j < max; j += 4) {
            EXPECT(std::string(j + 1, 's'), store.get(j));
            store.put(j, std::string(j + 1, 't'));
        }
        phase();
        for (int k = 2; k < max; k += 4) {
            EXPECT(not_found, store.get(k));
        }
        phase();
        for (int l = 3; l < max; l += 4) {
            EXPECT(std::string(l + 1, 's'), store.get(l));
        }
        phase();
        // Prepare data for Test Mode
        /*for (i = 0; i < max; ++i) {
            switch (i & 3) {
                case 0:
                    EXPECT(not_found, store.get(i));
                    store.put(i, std::string(i + 1, 't'));
                    break;
                case 1:
                    EXPECT(std::string(i + 1, 's'), store.get(i));
                    store.put(i, std::string(i + 1, 't'));
                    break;
                case 2:
                    EXPECT(not_found, store.get(i));
                    break;
                case 3:
                    EXPECT(std::string(i + 1, 's'), store.get(i));
                    break;
                default:
                    assert(0);
            }
        }*/

        report();

        /**
         * Write 10MB data to drain previous data out of memory.
         */
        for (i = 0; i <= 10240; ++i)
            store.put(max + i, std::string(1024, 'x'));

        std::cout << "Data is ready, please press ctrl-c/ctrl-d to"
                     " terminate this program!" << std::endl;
        std::cout.flush();

        exit(0);
    }